

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Zyx_ManAddCnfStart(Zyx_Man_t *p)

{
  Bmc_EsPar_t *pBVar1;
  int nlits;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int pLits [32];
  
  uVar5 = p->pPars->nVars;
  while( true ) {
    uVar7 = 0;
    if (0 < (int)uVar5) {
      uVar7 = (ulong)uVar5;
    }
    if (p->nObjs <= (int)uVar5) {
      iVar2 = 0;
      while( true ) {
        iVar3 = p->nObjs;
        pBVar1 = p->pPars;
        if (iVar3 + -1 <= iVar2) {
          if (pBVar1->nLutSize == 2) {
            for (iVar2 = pBVar1->nVars; iVar2 < iVar3; iVar2 = iVar2 + 1) {
              iVar3 = 3;
              while (iVar3 != 0) {
                pLits[0] = Abc_Var2Lit((iVar2 - p->pPars->nVars) * (p->LutMask + 1) + 1,
                                       (uint)(iVar3 == 2));
                pLits[1] = Abc_Var2Lit((iVar2 - p->pPars->nVars) * (p->LutMask + 1) + 2,
                                       (uint)(iVar3 == 1));
                pLits[2] = Abc_Var2Lit((iVar2 - p->pPars->nVars) * (p->LutMask + 1) + 3,
                                       (uint)(iVar3 != 3));
                iVar4 = bmcg_sat_solver_addclause(p->pSat,pLits,3);
                iVar3 = iVar3 + -1;
                if (iVar4 == 0) {
                  return 0;
                }
              }
              if (p->pPars->fOnlyAnd != 0) {
                pLits[0] = Abc_Var2Lit((iVar2 - p->pPars->nVars) * (p->LutMask + 1) + 1,1);
                pLits[1] = Abc_Var2Lit((iVar2 - p->pPars->nVars) * (p->LutMask + 1) + 2,1);
                pLits[2] = Abc_Var2Lit((iVar2 - p->pPars->nVars) * (p->LutMask + 1) + 3,0);
                iVar3 = bmcg_sat_solver_addclause(p->pSat,pLits,3);
                if (iVar3 == 0) {
                  return 0;
                }
              }
              iVar3 = p->nObjs;
            }
          }
          return 1;
        }
        iVar4 = pBVar1->nVars;
        for (lVar8 = 0; nlits = (int)lVar8, nlits + iVar4 < iVar3; lVar8 = lVar8 + 1) {
          iVar3 = Abc_Var2Lit(p->TopoBase + iVar2 + ((nlits + iVar4) - p->pPars->nVars) * iVar3,0);
          pLits[lVar8] = iVar3;
          iVar3 = p->nObjs;
        }
        if (lVar8 == 0) break;
        iVar3 = bmcg_sat_solver_addclause(p->pSat,pLits,nlits);
        iVar2 = iVar2 + 1;
        if (iVar3 == 0) {
          return 0;
        }
      }
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                    ,0x2a2,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
    }
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = Abc_Var2Lit((uVar5 - p->pPars->nVars) * p->nObjs + p->TopoBase + (int)uVar6,0);
      pLits[uVar6] = iVar2;
    }
    if ((int)uVar5 < 1) break;
    iVar2 = bmcg_sat_solver_addclause(p->pSat,pLits,(int)uVar7);
    uVar5 = uVar5 + 1;
    if (iVar2 == 0) {
      return 0;
    }
  }
  __assert_fail("nLits > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0x297,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
}

Assistant:

int Zyx_ManAddCnfStart( Zyx_Man_t * p )
{
    // nodes have fanins
    int i, k, pLits[MAJ3_OBJS];
    //printf( "Adding initial clauses:\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nLits = 0;
        for ( k = 0; k < i; k++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // nodes have fanouts
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        int nLits = 0;
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // two input functions
    if ( p->pPars->nLutSize != 2 )
        return 1;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), k==1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), k==2 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), k!=0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
        if ( p->pPars->fOnlyAnd )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), 1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), 1 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), 0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
    }
    return 1;
}